

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int json5Whitespace(char *zIn)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  iVar3 = 0;
LAB_001aa668:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar1 = zIn[iVar3];
          if (0x2e < bVar1) break;
          if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        if (0xe1 < bVar1) break;
        if (bVar1 == 0x2f) {
          if (zIn[(long)iVar3 + 1] != '/') {
            if (zIn[(long)iVar3 + 1] != '*') {
              return iVar3;
            }
            if (zIn[(long)iVar3 + 2] == '\0') {
              return iVar3;
            }
            iVar4 = iVar3 + 4;
            pcVar5 = zIn + (iVar3 + 3);
            do {
              if (*pcVar5 == '/') {
                if (pcVar5[-1] == '*') {
                  bVar2 = true;
                  iVar3 = iVar4;
                  goto LAB_001aa85b;
                }
              }
              else if (*pcVar5 == '\0') goto LAB_001aa7d3;
              iVar4 = iVar4 + 1;
              pcVar5 = pcVar5 + 1;
            } while( true );
          }
          iVar3 = iVar3 + 2;
          pcVar5 = zIn + (long)iVar3 + 2;
          while (((bVar1 = pcVar5[-2], bVar1 == 0xe2 || (0xd < bVar1)) ||
                 ((0x2401U >> (bVar1 & 0x1f) & 1) == 0))) {
            iVar3 = iVar3 + 1;
            pcVar5 = pcVar5 + 1;
          }
          iVar3 = (iVar3 + 1) - (uint)(zIn[iVar3] == '\0');
        }
        else {
          if (bVar1 != 0xc2) {
            return iVar3;
          }
          if (zIn[(long)iVar3 + 1] != -0x60) {
            return iVar3;
          }
          iVar3 = iVar3 + 2;
        }
      }
      if (bVar1 == 0xe2) break;
      if (bVar1 == 0xe3) {
        return iVar3;
      }
      if (bVar1 != 0xef) {
        return iVar3;
      }
      if (zIn[(long)iVar3 + 1] != -0x45) {
        return iVar3;
      }
      if (zIn[(long)iVar3 + 2] != -0x41) {
        return iVar3;
      }
LAB_001aa7cb:
      iVar3 = iVar3 + 3;
    }
    if (zIn[(long)iVar3 + 1] == -0x7f) {
      if (zIn[(long)iVar3 + 2] != -0x61) {
        return iVar3;
      }
      goto LAB_001aa7cb;
    }
    if (zIn[(long)iVar3 + 1] != -0x80) {
      return iVar3;
    }
    bVar1 = zIn[(long)iVar3 + 2];
    if ((char)bVar1 < '\0') {
      if (0x8a < bVar1) {
        bVar2 = false;
        if ((7 < bVar1 - 0xa8) || ((0x83U >> (bVar1 - 0xa8 & 0x1f) & 1) == 0)) goto LAB_001aa84a;
      }
      iVar3 = iVar3 + 3;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
LAB_001aa84a:
    if (!bVar2) {
      return iVar3;
    }
  } while( true );
LAB_001aa7d3:
  bVar2 = false;
LAB_001aa85b:
  if (!bVar2) {
    return iVar3;
  }
  goto LAB_001aa668;
}

Assistant:

static int json5Whitespace(const char *zIn){
  int n = 0;
  const u8 *z = (u8*)zIn;
  while( 1 /*exit by "goto whitespace_done"*/ ){
    switch( z[n] ){
      case 0x09:
      case 0x0a:
      case 0x0b:
      case 0x0c:
      case 0x0d:
      case 0x20: {
        n++;
        break;
      }
      case '/': {
        if( z[n+1]=='*' && z[n+2]!=0 ){
          int j;
          for(j=n+3; z[j]!='/' || z[j-1]!='*'; j++){
            if( z[j]==0 ) goto whitespace_done;
          }
          n = j+1;
          break;
        }else if( z[n+1]=='/' ){
          int j;
          char c;
          for(j=n+2; (c = z[j])!=0; j++){
            if( c=='\n' || c=='\r' ) break;
            if( 0xe2==(u8)c && 0x80==(u8)z[j+1]
             && (0xa8==(u8)z[j+2] || 0xa9==(u8)z[j+2])
            ){
              j += 2;
              break;
            }
          }
          n = j;
          if( z[n] ) n++;
          break;
        }
        goto whitespace_done;
      }
      case 0xc2: {
        if( z[n+1]==0xa0 ){
          n += 2;
          break;
        }
        goto whitespace_done;
      }
      case 0xe1: {
        if( z[n+1]==0x9a && z[n+2]==0x80 ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xe2: {
        if( z[n+1]==0x80 ){
          u8 c = z[n+2];
          if( c<0x80 ) goto whitespace_done;
          if( c<=0x8a || c==0xa8 || c==0xa9 || c==0xaf ){
            n += 3;
            break;
          }
        }else if( z[n+1]==0x81 && z[n+2]==0x9f ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xe3: {
        if( z[n+1]==0x80 && z[n+2]==0x80 ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      case 0xef: {
        if( z[n+1]==0xbb && z[n+2]==0xbf ){
          n += 3;
          break;
        }
        goto whitespace_done;
      }
      default: {
        goto whitespace_done;
      }
    }
  }
  whitespace_done:
  return n;
}